

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O3

Gia_Man_t * Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *pNtk,Vec_Ptr_t *vOrder)

{
  int iVar1;
  char *pcVar2;
  long *plVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *pVVar5;
  long *plVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  Gia_Man_t *p;
  size_t sVar10;
  char *pcVar11;
  Vec_Ptr_t *pVVar12;
  Gia_Obj_t *pGVar13;
  Gia_Man_t *pGVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  int gFanins [16];
  int local_78 [18];
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                  ,0x155,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  if (pNtk->nObjCounts[8] != 0) {
    __assert_fail("!Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                  ,0x156,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  Abc_NtkFillTemp(pNtk);
  p = Gia_ManStart(0x8000);
  pcVar2 = pNtk->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar2);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar2);
  }
  p->pName = pcVar11;
  pcVar2 = pNtk->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar2);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar2);
  }
  p->pSpec = pcVar11;
  Gia_ManHashAlloc(p);
  pVVar12 = pNtk->vPis;
  if (0 < pVVar12->nSize) {
    lVar15 = 0;
    do {
      plVar3 = (long *)pVVar12->pArray[lVar15];
      pGVar13 = Gia_ManAppendObj(p);
      uVar18 = *(ulong *)pGVar13;
      *(ulong *)pGVar13 = uVar18 | 0x9fffffff;
      *(ulong *)pGVar13 =
           uVar18 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p->pObjs;
      if ((pGVar13 < pGVar4) || (pGVar4 + p->nObjs <= pGVar13)) {
LAB_001d8f89:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p->pObjs;
      if ((pGVar13 < pGVar4) || (pGVar4 + p->nObjs <= pGVar13)) goto LAB_001d8f89;
      *(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8) +
              0x40) = (int)((ulong)((long)pGVar13 - (long)pGVar4) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
      pVVar12 = pNtk->vPis;
    } while (lVar15 < pVVar12->nSize);
  }
  if (0 < vOrder->nSize) {
    lVar15 = 0;
    do {
      plVar3 = (long *)vOrder->pArray[lVar15];
      uVar7 = *(uint *)((long)plVar3 + 0x14) & 0xf;
      if (uVar7 == 7) {
        iVar9 = *(int *)((long)plVar3 + 0x1c);
        if (0x10 < iVar9) {
          __assert_fail("Abc_ObjFaninNum(pObj) <= 16",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                        ,0x167,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
        }
        pcVar2 = (char *)plVar3[7];
        iVar8 = Abc_SopGetVarNum(pcVar2);
        if (iVar9 != iVar8) {
          __assert_fail("Abc_ObjFaninNum(pObj) == Abc_SopGetVarNum(pSop)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                        ,0x168,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
        }
        iVar9 = *(int *)((long)plVar3 + 0x1c);
        if (0 < (long)iVar9) {
          lVar19 = plVar3[4];
          lVar20 = *(long *)(*(long *)(*plVar3 + 0x20) + 8);
          lVar16 = 0;
          do {
            iVar8 = *(int *)(*(long *)(lVar20 + (long)*(int *)(lVar19 + lVar16 * 4) * 8) + 0x40);
            local_78[lVar16] = iVar8;
            if (iVar8 < 0) {
              __assert_fail("gFanins[k] >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                            ,0x16c,
                            "Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
            }
            lVar16 = lVar16 + 1;
          } while (iVar9 != lVar16);
        }
        iVar9 = Abc_NtkDeriveFlatGiaSop(p,local_78,pcVar2);
        *(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8) +
                0x40) = iVar9;
      }
      else {
        if (uVar7 != 10 && (*(uint *)((long)plVar3 + 0x14) & 0xe) != 8) {
          __assert_fail("Abc_ObjIsBox(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                        ,0x171,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
        }
        lVar19 = plVar3[7];
        if (*(int *)((long)plVar3 + 0x1c) != *(int *)(*(long *)(lVar19 + 0x28) + 4)) {
          __assert_fail("Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                        ,0x174,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
        }
        if (*(int *)((long)plVar3 + 0x2c) != *(int *)(*(long *)(lVar19 + 0x30) + 4)) {
          __assert_fail("Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                        ,0x175,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
        }
        pGVar14 = *(Gia_Man_t **)(lVar19 + 0x158);
        if (*(int *)((long)plVar3 + 0x1c) != pGVar14->vCis->nSize - pGVar14->nRegs) {
          __assert_fail("Abc_ObjFaninNum(pObj) == Gia_ManPiNum(pGiaBox)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                        ,0x182,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
        }
        if (*(int *)((long)plVar3 + 0x2c) != pGVar14->vCos->nSize - pGVar14->nRegs) {
          __assert_fail("Abc_ObjFanoutNum(pObj) == Gia_ManPoNum(pGiaBox)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                        ,0x183,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
        }
        Gia_ManFillValue(pGVar14);
        pGVar4 = pGVar14->pObjs;
        pGVar4->Value = 0;
        iVar9 = *(int *)((long)plVar3 + 0x1c);
        if ((long)iVar9 < 1) {
          iVar8 = pGVar14->nObjs;
          if (0 < iVar8) goto LAB_001d8ca6;
        }
        else {
          lVar19 = plVar3[4];
          pVVar5 = pGVar14->vCis;
          uVar7 = pVVar5->nSize;
          uVar17 = uVar7 - pGVar14->nRegs;
          lVar20 = *(long *)(*(long *)(*plVar3 + 0x20) + 8);
          if ((int)uVar17 < 1) {
            uVar17 = 0;
          }
          if ((int)uVar7 < 1) {
            uVar7 = 0;
          }
          uVar18 = 0;
          do {
            if (uVar17 == uVar18) {
              __assert_fail("v < Gia_ManPiNum(p)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1b2,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
            }
            if (uVar7 == uVar18) goto LAB_001d8eee;
            iVar1 = pVVar5->pArray[uVar18];
            if (((long)iVar1 < 0) || (iVar8 = pGVar14->nObjs, iVar8 <= iVar1)) goto LAB_001d8ecf;
            plVar6 = *(long **)(lVar20 + (long)*(int *)(lVar19 + uVar18 * 4) * 8);
            pGVar4[iVar1].Value =
                 *(uint *)(*(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                    (long)*(int *)plVar6[4] * 8) + 0x40);
            uVar18 = uVar18 + 1;
          } while ((long)iVar9 != uVar18);
LAB_001d8ca6:
          lVar19 = 8;
          lVar20 = 0;
          while (pGVar4 = pGVar14->pObjs, pGVar4 != (Gia_Obj_t *)0x0) {
            uVar18 = *(ulong *)((long)pGVar4 + lVar19 + -8);
            if ((uVar18 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar18) {
              uVar7 = *(uint *)((long)pGVar4 +
                               lVar19 + (ulong)(uint)((int)(uVar18 & 0x1fffffff) << 2) * -3);
              if (((int)uVar7 < 0) ||
                 (uVar17 = *(uint *)((long)pGVar4 +
                                    lVar19 + (ulong)((uint)(uVar18 >> 0x1e) & 0x7ffffffc) * -3),
                 (int)uVar17 < 0)) goto LAB_001d8f0d;
              iVar9 = Gia_ManHashAnd(p,uVar7 ^ (uint)(uVar18 >> 0x1d) & 1,
                                     uVar17 ^ (uint)(uVar18 >> 0x3d) & 1);
              *(int *)(&pGVar4->field_0x0 + lVar19) = iVar9;
              iVar8 = pGVar14->nObjs;
            }
            lVar20 = lVar20 + 1;
            lVar19 = lVar19 + 0xc;
            if (iVar8 <= lVar20) break;
          }
        }
        if (0 < *(int *)((long)plVar3 + 0x2c)) {
          lVar19 = 0;
          do {
            lVar20 = (long)pGVar14->vCos->nSize;
            if (lVar20 - pGVar14->nRegs <= lVar19) {
              __assert_fail("v < Gia_ManPoNum(p)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
            }
            if (lVar20 <= lVar19) {
LAB_001d8eee:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar9 = pGVar14->vCos->pArray[lVar19];
            if (((long)iVar9 < 0) || (pGVar14->nObjs <= iVar9)) {
LAB_001d8ecf:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            uVar17 = (uint)*(undefined8 *)(pGVar14->pObjs + iVar9);
            uVar7 = (pGVar14->pObjs + iVar9)[-(ulong)(uVar17 & 0x1fffffff)].Value;
            if ((int)uVar7 < 0) {
LAB_001d8f0d:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf5,"int Abc_LitNotCond(int, int)");
            }
            plVar6 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)(plVar3[6] + lVar19 * 4) * 8);
            *(uint *)(*(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                               (long)*(int *)plVar6[6] * 8) + 0x40) = uVar17 >> 0x1d & 1 ^ uVar7;
            lVar19 = lVar19 + 1;
          } while (lVar19 < *(int *)((long)plVar3 + 0x2c));
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < vOrder->nSize);
  }
  pVVar12 = pNtk->vPos;
  if (0 < pVVar12->nSize) {
    lVar15 = 0;
    do {
      Gia_ManAppendCo(p,*(int *)(*(long *)(*(long *)(*(long *)(*pVVar12->pArray[lVar15] + 0x20) + 8)
                                          + (long)**(int **)((long)pVVar12->pArray[lVar15] + 0x20) *
                                            8) + 0x40));
      lVar15 = lVar15 + 1;
      pVVar12 = pNtk->vPos;
    } while (lVar15 < pVVar12->nSize);
  }
  Gia_ManHashStop(p);
  Gia_ManSetRegNum(p,0);
  pGVar14 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  Abc_NtkCountAndNodes(vOrder);
  printf("%8d -> ");
  Gia_ManPrintStats(pGVar14,(Gps_Par_t *)0x0);
  return pGVar14;
}

Assistant:

Gia_Man_t * Abc_NtkDeriveFlatGia2Derive( Abc_Ntk_t * pNtk, Vec_Ptr_t * vOrder )
{
    int gFanins[16];
    Abc_Ntk_t * pNtkModel;
    Gia_Man_t * pGiaBox, * pGia = NULL;
    Gia_Obj_t * pGiaObj;
    Abc_Obj_t * pTerm, * pObj;
    int i, k;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( !Abc_NtkLatchNum(pNtk) );
    Abc_NtkFillTemp( pNtk );

    // start the network
    pGia = Gia_ManStart( (1<<15) );
    pGia->pName = Abc_UtilStrsav( Abc_NtkName(pNtk) );
    pGia->pSpec = Abc_UtilStrsav( Abc_NtkSpec(pNtk) );
    Gia_ManHashAlloc( pGia );
    // create PIs
    Abc_NtkForEachPi( pNtk, pTerm, i )
        Abc_ObjFanout0(pTerm)->iTemp = Gia_ManAppendCi( pGia );
    // recursively flatten hierarchy
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
        {
            char * pSop = (char *)pObj->pData;
            assert( Abc_ObjFaninNum(pObj) <= 16 );
            assert( Abc_ObjFaninNum(pObj) == Abc_SopGetVarNum(pSop) );
            Abc_ObjForEachFanin( pObj, pTerm, k )
            {
                gFanins[k] = pTerm->iTemp;
                assert( gFanins[k] >= 0 );
            }
            Abc_ObjFanout0(pObj)->iTemp = Abc_NtkDeriveFlatGiaSop( pGia, gFanins, pSop );
            continue;
        }
        assert( Abc_ObjIsBox(pObj) );
        pNtkModel = (Abc_Ntk_t *)pObj->pData;
        // check the match between the number of actual and formal parameters
        assert( Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel) );
        assert( Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel) );
/*
        // assign PIs
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Abc_ObjFanout0( Abc_NtkPi(pNtkModel, k) )->iTemp = Abc_ObjFanin0(pTerm)->iTemp;
        // call recursively
        Abc_NtkDeriveFlatGia_rec( pGia, pNtkModel );
        // assign POs
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjFanout0(pTerm)->iTemp = Abc_ObjFanin0( Abc_NtkPo(pNtkModel, k) )->iTemp;
*/ 
        // duplicate the AIG
        pGiaBox = (Gia_Man_t *)pNtkModel->pData;
        assert( Abc_ObjFaninNum(pObj) == Gia_ManPiNum(pGiaBox) );
        assert( Abc_ObjFanoutNum(pObj) == Gia_ManPoNum(pGiaBox) );
        Gia_ManFillValue( pGiaBox );
        Gia_ManConst0(pGiaBox)->Value = 0;
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Gia_ManPi(pGiaBox, k)->Value = Abc_ObjFanin0(pTerm)->iTemp;
        Gia_ManForEachAnd( pGiaBox, pGiaObj, k )
            pGiaObj->Value = Gia_ManHashAnd( pGia, Gia_ObjFanin0Copy(pGiaObj), Gia_ObjFanin1Copy(pGiaObj) );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjFanout0(pTerm)->iTemp = Gia_ObjFanin0Copy(Gia_ManPo(pGiaBox, k));
    }
    // create POs
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Gia_ManAppendCo( pGia, Abc_ObjFanin0(pTerm)->iTemp );
    // prepare return value
    Gia_ManHashStop( pGia );
    Gia_ManSetRegNum( pGia, 0 );
    pGia = Gia_ManCleanup( pGiaBox = pGia );
    Gia_ManStop( pGiaBox );

    printf( "%8d -> ", Abc_NtkCountAndNodes(vOrder) );
    Gia_ManPrintStats( pGia, NULL );
    return pGia;
}